

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleTree::cellAt(QAccessibleTree *this,int row,int column)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QAccessibleInterface *pQVar4;
  uint in_EDX;
  uint in_ESI;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int logicalIndex;
  QTreeView *treeView;
  QModelIndex index;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QMessageLogger *in_stack_ffffffffffffffa0;
  QTreeViewPrivate *this_00;
  undefined8 in_stack_ffffffffffffffb8;
  QAccessibleTree *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  indexFromLogical(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (int)in_stack_ffffffffffffffb8);
  bVar2 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    QAccessibleTable::view((QAccessibleTable *)0x7f7e9c);
    qobject_cast<QTreeView_const*>((QObject *)0x7f7ea4);
    QTreeView::d_func((QTreeView *)0x7f7eb3);
    iVar3 = QTreeViewPrivate::accessibleTable2Index(this_00,(QModelIndex *)CONCAT44(in_ESI,in_EDX));
    pQVar4 = (QAccessibleInterface *)
             (**(code **)(*(long *)&(in_RDI->super_QAbstractItemViewPrivate).
                                    super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                    super_QWidgetPrivate + 0x100))(in_RDI,iVar3);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff88);
    QMessageLogger::warning
              (&stack0xffffffffffffffc0,"Requested invalid tree cell: %d %d",(ulong)in_ESI,
               (ulong)in_EDX);
    pQVar4 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleTree::cellAt(int row, int column) const
{
    QModelIndex index = indexFromLogical(row, column);
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning("Requested invalid tree cell: %d %d", row, column);
        return nullptr;
    }
    const QTreeView *treeView = qobject_cast<const QTreeView*>(view());
    Q_ASSERT(treeView);
    int logicalIndex = treeView->d_func()->accessibleTable2Index(index);

    return child(logicalIndex);
}